

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QUnicodeTables::convertCase<QString_const>(QString *str,Case which)

{
  long lVar1;
  bool bVar2;
  char32_t ucs4;
  const_iterator begin;
  qsizetype qVar3;
  Properties *pPVar4;
  uint in_EDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringIterator in_stack_00000030;
  char32_t uc;
  QChar *e;
  QChar *p;
  QStringIterator it;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QStringIterator *in_stack_ffffffffffffff68;
  QStringIterator *in_stack_ffffffffffffff70;
  bool local_81;
  QChar *local_60;
  const_iterator pQVar5;
  Case which_00;
  QString *str_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  begin = QString::constBegin((QString *)0x5153cd);
  qVar3 = QString::size(in_RSI);
  local_60 = begin + qVar3;
  while( true ) {
    local_81 = false;
    if (local_60 != begin) {
      local_81 = QChar::isHighSurrogate((QChar *)0x515419);
    }
    if (local_81 == false) break;
    local_60 = local_60 + -1;
  }
  pQVar5 = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  str_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QStringIterator::QStringIterator((QStringIterator *)&stack0xffffffffffffffe0,begin,local_60);
  do {
    bVar2 = QStringIterator::hasNext((QStringIterator *)0x515488);
    if (!bVar2) {
      QString::QString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      goto LAB_00515540;
    }
    ucs4 = QStringIterator::next
                     (in_stack_ffffffffffffff68,(char32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20)
                     );
    pPVar4 = qGetProp(ucs4);
    which_00 = (Case)((ulong)pQVar5 >> 0x20);
  } while ((short)pPVar4->cases[in_EDX] >> 1 == 0);
  QStringIterator::recede(in_stack_ffffffffffffff70);
  detachAndConvertCase<QString_const>(str_00,in_stack_00000030,which_00);
LAB_00515540:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}